

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash *
Internal_FaceHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                 ON_SubDFace *first_face,uint level_index,ON_SubDFaceIdIterator *fidit)

{
  bool bVar1;
  uint uVar2;
  ON_SubDFace *local_b8;
  ON_SubDFace *f;
  undefined1 local_a8 [4];
  uint prev_id;
  ON_SHA1 sha1;
  ON_SubDFaceIdIterator *fidit_local;
  uint level_index_local;
  ON_SubDFace *first_face_local;
  ON_SubDHashType hash_type_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = fidit;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_a8);
  if (hash_type != Unset) {
    f._4_4_ = 0;
    for (local_b8 = first_face; local_b8 != (ON_SubDFace *)0x0; local_b8 = local_b8->m_next_face) {
      if ((local_b8->super_ON_SubDComponentBase).m_id < f._4_4_) {
        ON_SHA1::Reset((ON_SHA1 *)local_a8);
        local_b8 = ON_SubDFaceIdIterator::FirstFace
                             ((ON_SubDFaceIdIterator *)sha1.m_sha1_hash.m_digest._12_8_);
        while (local_b8 != (ON_SubDFace *)0x0) {
          uVar2 = ON_SubDComponentBase::SubdivisionLevel(&local_b8->super_ON_SubDComponentBase);
          if ((level_index == uVar2) &&
             (bVar1 = ON_SubDComponentBase::IsActive(&local_b8->super_ON_SubDComponentBase), bVar1))
          {
            Internal_AccumulateFaceHash((ON_SHA1 *)local_a8,hash_type,local_b8);
          }
          local_b8 = ON_SubDFaceIdIterator::NextFace
                               ((ON_SubDFaceIdIterator *)sha1.m_sha1_hash.m_digest._12_8_);
        }
        break;
      }
      Internal_AccumulateFaceHash((ON_SHA1 *)local_a8,hash_type,local_b8);
      f._4_4_ = (local_b8->super_ON_SubDComponentBase).m_id;
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_FaceHash(ON_SubDHashType hash_type, const ON_SubDFace* first_face, unsigned int level_index, ON_SubDFaceIdIterator& fidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDFace* f = first_face; nullptr != f; f = f->m_next_face)
    {
      if (prev_id > f->m_id)
      {
        // must use slower fidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (f = fidit.FirstFace(); nullptr != f; f = fidit.NextFace())
        {
          if (level_index == f->SubdivisionLevel() && f->IsActive())
            Internal_AccumulateFaceHash(sha1, hash_type, f);
        }
        break;
      }
      Internal_AccumulateFaceHash(sha1, hash_type, f);
      prev_id = f->m_id;
    }
  }
  return sha1.Hash();
}